

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

pair<bool,_bool> qpdf::Name::analyzeJSONEncoding(string *name)

{
  byte bVar1;
  pair<bool,_bool> pVar2;
  int iVar7;
  size_type sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  pair<bool,_bool> pVar3;
  pair<bool,_bool> pVar4;
  pair<bool,_bool> pVar5;
  pair<bool,_bool> pVar6;
  
  sVar8 = 0;
  bVar9 = false;
  bVar11 = false;
  bVar10 = false;
  iVar7 = 0;
  do {
    if (name->_M_string_length == sVar8) {
      return (pair<bool,_bool>)(CONCAT11(~bVar9,iVar7 == 0) & 0x1ff);
    }
    bVar1 = (name->_M_dataplus)._M_p[sVar8];
    if (iVar7 == 0) {
      if ((char)bVar1 < '\0') {
        if ((bVar1 & 0xe0) == 0xc0) {
          iVar7 = 1;
          if ((bVar1 & 0xde) == 0xc0) {
            pVar5.first = false;
            pVar5.second = false;
            return pVar5;
          }
        }
        else if ((bVar1 & 0xf0) == 0xe0) {
          bVar10 = bVar1 == 0xe0;
          iVar7 = 2;
        }
        else {
          if ((bVar1 & 0xf8) != 0xf0) {
            pVar6.first = false;
            pVar6.second = false;
            return pVar6;
          }
          bVar11 = bVar1 == 0xf0;
          iVar7 = 3;
        }
      }
      else {
        iVar7 = 0;
        if (!bVar9) {
          bVar9 = (byte)(bVar1 - 0x22) < 0xfe && (bVar1 == 0x5c || bVar1 < 0x23);
        }
      }
    }
    else {
      if ((bVar1 & 0xc0) != 0x80) {
        pVar3.first = false;
        pVar3.second = false;
        return pVar3;
      }
      if (bVar10) {
        if ((bVar1 & 0xa0) == 0x80) {
          pVar4.first = false;
          pVar4.second = false;
          return pVar4;
        }
      }
      else {
        bVar10 = (bool)(bVar11 & (bVar1 & 0xb0) == 0x80);
        bVar11 = false;
        if (bVar10) {
          pVar2.first = false;
          pVar2.second = false;
          return pVar2;
        }
      }
      iVar7 = iVar7 + -1;
      bVar10 = false;
    }
    sVar8 = sVar8 + 1;
  } while( true );
}

Assistant:

LastChar::LastChar(Pipeline& next) :
    Pipeline("lastchar", &next)
{
}